

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

int oonf_layer2_validate_mac_lid
              (cfg_schema_entry *entry,char *section_name,char *value,autobuf *out)

{
  int iVar1;
  undefined1 local_53 [3];
  int result;
  oonf_layer2_neigh_key key;
  autobuf *out_local;
  char *value_local;
  char *section_name_local;
  cfg_schema_entry *entry_local;
  
  key.link_id._8_8_ = out;
  iVar1 = oonf_layer2_neigh_key_from_string((oonf_layer2_neigh_key *)local_53,value);
  switch(iVar1) {
  case -4:
    cfg_append_printable_line
              ((autobuf *)key.link_id._8_8_,
               "Address \'%s\' for entry \'%s\' in section %s is not MAC48 or EUI64",value,
               (entry->key).entry,section_name);
    break;
  case -3:
    cfg_append_printable_line
              ((autobuf *)key.link_id._8_8_,
               "Address \'%s\' for entry \'%s\' in section %s is not a valid address",value,
               (entry->key).entry,section_name);
    break;
  case -2:
    cfg_append_printable_line
              ((autobuf *)key.link_id._8_8_,
               "Link-id \'%s\' for entry \'%s\' in section %s is not hexadecimal or too long",value,
               (entry->key).entry,section_name);
    break;
  case -1:
    cfg_append_printable_line
              ((autobuf *)key.link_id._8_8_,
               "Address \'%s\' for entry \'%s\' in section %s is too long",value,(entry->key).entry,
               section_name);
    break;
  default:
    return 0;
  }
  return -1;
}

Assistant:

int
oonf_layer2_validate_mac_lid(const struct cfg_schema_entry *entry,
    const char *section_name, const char *value, struct autobuf *out) {
  struct oonf_layer2_neigh_key key;
  int result;

  result = oonf_layer2_neigh_key_from_string(&key, value);
  switch (result) {
    case -1:
      cfg_append_printable_line(out,
          "Address '%s' for entry '%s' in section %s is too long",
          value, entry->key.entry, section_name);
      break;
    case -2:
      cfg_append_printable_line(out,
          "Link-id '%s' for entry '%s' in section %s is not hexadecimal or too long",
          value, entry->key.entry, section_name);
      break;
    case -3:
      cfg_append_printable_line(out,
          "Address '%s' for entry '%s' in section %s is not a valid address",
          value, entry->key.entry, section_name);
      break;
    case -4:
      cfg_append_printable_line(out,
          "Address '%s' for entry '%s' in section %s is not MAC48 or EUI64",
          value, entry->key.entry, section_name);
      break;
    default:
      return 0;
  }
  return -1;
}